

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O0

int zt_mem_page_destroy(zt_mem_page *page)

{
  zt_elist *pzVar1;
  int iVar2;
  zt_elist_t *in_RDI;
  size_t size;
  unsigned_long i;
  zt_mem_elt *elt;
  zt_elist *local_20;
  zt_elist_t *local_18;
  int local_4;
  
  if (in_RDI[1].next < in_RDI[1].prev[4].prev) {
    printf("error: %s called when elements are still in use!\n","zt_mem_page_destroy");
    local_4 = 1;
  }
  else {
    in_RDI[1].prev[3].next = (zt_elist *)((long)&in_RDI[1].prev[3].next[-1].next + 7);
    in_RDI[1].prev[3].prev = (zt_elist *)((long)&in_RDI[1].prev[3].prev[-1].next + 7);
    pzVar1 = in_RDI[1].prev[4].next;
    local_18 = in_RDI + 2;
    for (local_20 = (zt_elist *)0x0; local_20 < in_RDI[1].next;
        local_20 = (zt_elist *)((long)&local_20->prev + 1)) {
      iVar2 = zt_elist_empty(local_18);
      if (iVar2 == 0) {
        zt_elist_remove((zt_elist_t *)0x104372);
      }
      local_18 = (zt_elist_t *)((long)&local_18[1].next + (long)pzVar1);
    }
    iVar2 = zt_elist_empty(in_RDI);
    if (iVar2 == 0) {
      zt_elist_remove((zt_elist_t *)0x1043a9);
    }
    (*GLOBAL_zmt.dealloc)(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
zt_mem_page_destroy(zt_mem_page *page)
{
    zt_mem_elt * elt;
    unsigned long i;
    size_t       size;

    if (page->num_free_elts < page->parent_pool->elts_per_page) {
        printf("error: %s called when elements are still in use!\n", ZT_LOG_FUNCTION);
        return 1;
    }

    page->parent_pool->npages--;
    page->parent_pool->nfree_pages--;

    size = sizeof(zt_mem_elt) + page->parent_pool->elt_size;
    elt = (zt_mem_elt *)page->data;
    /* remove the elements from the free element list */
    for (i = 0; i < page->num_free_elts; i++) {
        if (zt_elist_empty(&elt->free_elt_list) == 0) {
            zt_elist_remove(&elt->free_elt_list);
        }
        elt = (zt_mem_elt *)((unsigned long)elt + size);
    }
    /* remove the page from the page list */
    if (zt_elist_empty(&page->page_list) == 0) {
        zt_elist_remove(&page->page_list);
    }
    GLOBAL_zmt.dealloc(page);
    return 0;
}